

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O3

BOOL read_name(PCRE2_SPTR16 *ptrptr,PCRE2_SPTR16 ptrend,uint32_t terminator,size_t *offsetptr,
              PCRE2_SPTR16 *nameptr,uint32_t *namelenptr,int *errorcodeptr,compile_block_16 *cb)

{
  PCRE2_UCHAR16 PVar1;
  PCRE2_SPTR16 pPVar2;
  BOOL BVar3;
  uint32_t uVar4;
  byte bVar5;
  long lVar6;
  ushort *puVar7;
  
  pPVar2 = *ptrptr;
  PVar1 = *pPVar2;
  bVar5 = 0x10;
  if (PVar1 == 0x2a) {
    bVar5 = 2;
  }
  puVar7 = pPVar2 + 1;
  if (puVar7 < ptrend) {
    *nameptr = puVar7;
    *offsetptr = (long)puVar7 - (long)cb->start_pattern >> 1;
    if (9 < (ushort)(*puVar7 - 0x30)) {
      lVar6 = 0;
      uVar4 = 0;
      do {
        puVar7 = (ushort *)((long)pPVar2 + lVar6 + 2);
        if (((ptrend <= puVar7) || (0xff < (ulong)*puVar7)) || ((bVar5 & cb->ctypes[*puVar7]) == 0))
        {
          if (PVar1 != 0x2a) {
            if ((int)lVar6 == 0) {
              *errorcodeptr = 0xa2;
              goto LAB_00143863;
            }
            if ((ptrend <= puVar7) || (*puVar7 != (ushort)terminator)) {
              *errorcodeptr = 0x8e;
              goto LAB_00143863;
            }
            puVar7 = (ushort *)((long)pPVar2 + lVar6 + 4);
          }
          *namelenptr = uVar4;
          BVar3 = 1;
          goto LAB_00143865;
        }
        uVar4 = uVar4 + 1;
        lVar6 = lVar6 + 2;
      } while ((int)lVar6 != 0x42);
      *errorcodeptr = 0x94;
      BVar3 = 0;
      puVar7 = pPVar2 + 0x22;
      goto LAB_00143865;
    }
    *errorcodeptr = 0x90;
  }
  else {
    *errorcodeptr = (uint)(PVar1 != 0x2a) * 2 + 0xa0;
  }
LAB_00143863:
  BVar3 = 0;
LAB_00143865:
  *ptrptr = puVar7;
  return BVar3;
}

Assistant:

static BOOL
read_name(PCRE2_SPTR *ptrptr, PCRE2_SPTR ptrend, uint32_t terminator,
  PCRE2_SIZE *offsetptr, PCRE2_SPTR *nameptr, uint32_t *namelenptr,
  int *errorcodeptr, compile_block *cb)
{
PCRE2_SPTR ptr = *ptrptr;
BOOL is_verb = (*ptr == CHAR_ASTERISK);
uint32_t namelen = 0;
uint32_t ctype = is_verb? ctype_letter : ctype_word;

if (++ptr >= ptrend)
  {
  *errorcodeptr = is_verb? ERR60:  /* Verb not recognized or malformed */
                           ERR62;  /* Subpattern name expected */
  goto FAILED;
  }

*nameptr = ptr;
*offsetptr = (PCRE2_SIZE)(ptr - cb->start_pattern);

if (IS_DIGIT(*ptr))
  {
  *errorcodeptr = ERR44;   /* Group name must not start with digit */
  goto FAILED;
  }

while (ptr < ptrend && MAX_255(*ptr) && (cb->ctypes[*ptr] & ctype) != 0)
  {
  ptr++;
  namelen++;
  if (namelen > MAX_NAME_SIZE)
    {
    *errorcodeptr = ERR48;
    goto FAILED;
    }
  }

/* Subpattern names must not be empty, and their terminator is checked here.
(What follows a verb name is checked separately.) */

if (!is_verb)
  {
  if (namelen == 0)
    {
    *errorcodeptr = ERR62;   /* Subpattern name expected */
    goto FAILED;
    }
  if (ptr >= ptrend || *ptr != (PCRE2_UCHAR)terminator)
    {
    *errorcodeptr = ERR42;
    goto FAILED;
    }
  ptr++;
  }

*namelenptr = namelen;
*ptrptr = ptr;
return TRUE;

FAILED:
*ptrptr = ptr;
return FALSE;
}